

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  uint uVar2;
  size_type sVar3;
  byte bVar4;
  Error EVar5;
  OptionAdder *pOVar6;
  size_t sVar7;
  OptionValue *pOVar8;
  ostream *poVar9;
  FILE *pFVar10;
  size_type sVar11;
  byte bVar12;
  int i_1;
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  ParseResult *this;
  int i_4;
  size_t i;
  long lVar18;
  _Alloc_hider _Var19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  File write_file;
  allocator local_7b1;
  allocator local_7b0;
  allocator local_7af;
  allocator local_7ae;
  allocator local_7ad;
  allocator local_7ac;
  allocator local_7ab;
  allocator local_7aa;
  allocator local_7a9;
  allocator local_7a8;
  allocator local_7a7;
  allocator local_7a6;
  allocator local_7a5;
  allocator local_7a4;
  allocator local_7a3;
  allocator local_7a2;
  allocator local_7a1;
  allocator local_7a0;
  allocator local_79f;
  allocator local_79e;
  allocator local_79d;
  allocator local_79c;
  allocator local_79b;
  allocator local_79a;
  allocator local_799;
  string local_798;
  string local_778;
  ParseResult result;
  string name;
  string local_698;
  string local_678;
  string output_file;
  string input_file;
  shared_ptr<const_cxxopts::Value> local_618;
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_600;
  shared_ptr<const_cxxopts::Value> local_5f8;
  element_type *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5e0;
  shared_ptr<const_cxxopts::Value> local_5d8;
  element_type *local_5c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5c0;
  shared_ptr<const_cxxopts::Value> local_5b8;
  element_type *local_5a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5a0;
  shared_ptr<const_cxxopts::Value> local_598;
  element_type *local_588;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_580;
  shared_ptr<const_cxxopts::Value> local_578;
  element_type *local_568;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_560;
  shared_ptr<const_cxxopts::Value> local_558;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  element_type *local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4a0;
  shared_ptr<const_cxxopts::Value> local_498;
  element_type *local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_480;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  Options options;
  string local_50 [32];
  
  input_file._M_dataplus._M_p = (pointer)&input_file.field_2;
  input_file._M_string_length = 0;
  output_file._M_dataplus._M_p = (pointer)&output_file.field_2;
  output_file._M_string_length = 0;
  input_file.field_2._M_local_buf[0] = '\0';
  output_file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&name,*argv,(allocator *)&options);
  std::__cxx11::string::string((string *)&local_278,name._M_dataplus._M_p,(allocator *)&result);
  std::operator+(&local_298,&name," - Orao cassette tape tool");
  cxxopts::Options::Options(&options,&local_278,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string(local_50,"[optional args]",(allocator *)&result);
  std::__cxx11::string::operator=((string *)&options.m_positional_help,local_50);
  options.m_show_positional = true;
  std::__cxx11::string::~string(local_50);
  options.m_allow_unrecognised = true;
  std::__cxx11::string::string((string *)&local_2b8,"",&local_799);
  cxxopts::Options::add_options((OptionAdder *)&result,&options,&local_2b8);
  std::__cxx11::string::string((string *)&write_file,"i,input",&local_79a);
  std::__cxx11::string::string((string *)&local_798,"Input",&local_79b);
  cxxopts::value<std::__cxx11::string>();
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_568;
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_560._M_pi;
  local_568 = (element_type *)0x0;
  _Stack_560._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_2d8,"",&local_79c);
  pOVar6 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&result,(string *)&write_file,&local_798,&local_558,&local_2d8)
  ;
  std::__cxx11::string::string((string *)&local_778,"o,output",&local_79d);
  std::__cxx11::string::string((string *)&local_678,"Output file",&local_79e);
  cxxopts::value<std::__cxx11::string>();
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_588;
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_580._M_pi;
  local_588 = (element_type *)0x0;
  _Stack_580._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_2f8,"",&local_79f);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_778,&local_678,&local_578,&local_2f8);
  std::__cxx11::string::string((string *)&local_698,"tap",&local_7a0);
  std::__cxx11::string::string((string *)&local_4c8,"Convert WAV to TAP",&local_7a1);
  cxxopts::value<bool>();
  local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5a8;
  local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5a0._M_pi;
  local_5a8 = (element_type *)0x0;
  _Stack_5a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_318,"",&local_7a2);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_698,&local_4c8,&local_598,&local_318);
  std::__cxx11::string::string((string *)&local_4e8,"oldtap",&local_7a3);
  std::__cxx11::string::string((string *)&local_508,"Convert WAV to oldTAP",&local_7a4);
  cxxopts::value<bool>();
  local_5b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5c8;
  local_5b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5c0._M_pi;
  local_5c8 = (element_type *)0x0;
  _Stack_5c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_338,"",&local_7a5);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_4e8,&local_508,&local_5b8,&local_338);
  std::__cxx11::string::string((string *)&local_528,"wav",&local_7a6);
  std::__cxx11::string::string((string *)&local_548,"Convert TAP to WAV",&local_7a7);
  cxxopts::value<bool>();
  local_5d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_5e8;
  local_5d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_5e0._M_pi;
  local_5e8 = (element_type *)0x0;
  _Stack_5e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_358,"",&local_7a8);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_528,&local_548,&local_5d8,&local_358);
  std::__cxx11::string::string((string *)&local_378,"old2new",&local_7a9);
  std::__cxx11::string::string((string *)&local_398,"Convert old TAP to new TAP",&local_7aa);
  cxxopts::value<bool>();
  local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_608;
  local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_600._M_pi;
  local_608 = (element_type *)0x0;
  _Stack_600._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_3b8,"",&local_7ab);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_378,&local_398,&local_5f8,&local_3b8);
  std::__cxx11::string::string((string *)&local_3d8,"new2old",&local_7ac);
  std::__cxx11::string::string
            ((string *)&local_3f8,"Convert new TAP to old TAP <WARNING: header will not be good>",
             &local_7ad);
  cxxopts::value<bool>();
  local_618.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_488;
  local_618.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_480._M_pi;
  local_488 = (element_type *)0x0;
  _Stack_480._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_418,"",&local_7ae);
  pOVar6 = cxxopts::OptionAdder::operator()(pOVar6,&local_3d8,&local_3f8,&local_618,&local_418);
  std::__cxx11::string::string((string *)&local_438,"help",&local_7af);
  std::__cxx11::string::string((string *)&local_458,"Print help",&local_7b0);
  cxxopts::value<bool>();
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4a8;
  local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4a0._M_pi;
  local_4a8 = (element_type *)0x0;
  _Stack_4a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_478,"",&local_7b1);
  cxxopts::OptionAdder::operator()(pOVar6,&local_438,&local_458,&local_498,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4a0);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_618.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_480);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_600);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5e0);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_338);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5c0);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_598.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5a0);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_580);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_560);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&write_file);
  std::__cxx11::string::~string((string *)&result.m_keys._M_h._M_bucket_count);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string((string *)&result,"input",(allocator *)&write_file);
  std::__cxx11::string::string
            ((string *)&result.m_keys._M_h._M_rehash_policy,"output",(allocator *)&local_798);
  options_00._M_len = 2;
  options_00._M_array = (iterator)&result;
  cxxopts::Options::parse_positional(&options,options_00);
  lVar14 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&result.m_keys._M_h._M_buckets + lVar14));
    lVar14 = lVar14 + -0x20;
  } while (lVar14 != -0x20);
  cxxopts::Options::parse(&result,&options,argc,argv);
  std::__cxx11::string::string((string *)&write_file,"help",(allocator *)&local_798);
  sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
  if (sVar7 != 0) {
    std::__cxx11::string::~string((string *)&write_file);
LAB_00108133:
    local_798._M_dataplus._M_p = (pointer)0x0;
    local_798._M_string_length = 0;
    local_798.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)&write_file,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_798);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&write_file);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&write_file);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_798);
    exit(0);
  }
  std::__cxx11::string::~string((string *)&write_file);
  if (result.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      result.m_sequential.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00108133;
  std::__cxx11::string::string((string *)&write_file,"input",(allocator *)&local_798);
  sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
  std::__cxx11::string::~string((string *)&write_file);
  if (sVar7 == 0) {
    pcVar17 = "Input file is mandatory.";
LAB_001074a3:
    poVar9 = std::operator<<((ostream *)&std::cerr,pcVar17);
    std::endl<char,std::char_traits<char>>(poVar9);
    uVar13 = 1;
    bVar26 = false;
    bVar25 = false;
    bVar22 = false;
    bVar24 = false;
    bVar23 = false;
    bVar21 = false;
  }
  else {
    std::__cxx11::string::string((string *)&write_file,"input",(allocator *)&local_798);
    pOVar8 = cxxopts::ParseResult::operator[](&result,(string *)&write_file);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
    std::__cxx11::string::_M_assign((string *)&input_file);
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"output",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    std::__cxx11::string::~string((string *)&write_file);
    if (sVar7 == 0) {
      pcVar17 = "Output file is mandatory.";
      goto LAB_001074a3;
    }
    std::__cxx11::string::string((string *)&write_file,"output",(allocator *)&local_798);
    pOVar8 = cxxopts::ParseResult::operator[](&result,(string *)&write_file);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar8);
    std::__cxx11::string::_M_assign((string *)&output_file);
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"wav",(allocator *)&local_4c8);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    if (sVar7 == 0) {
LAB_001074e9:
      std::__cxx11::string::~string((string *)&write_file);
    }
    else {
      std::__cxx11::string::string((string *)&local_798,"tap",(allocator *)&local_4e8);
      sVar7 = cxxopts::ParseResult::count(&result,&local_798);
      if (sVar7 == 0) {
LAB_001074df:
        std::__cxx11::string::~string((string *)&local_798);
        goto LAB_001074e9;
      }
      std::__cxx11::string::string((string *)&local_778,"old2new",(allocator *)&local_508);
      sVar7 = cxxopts::ParseResult::count(&result,&local_778);
      if (sVar7 == 0) {
        std::__cxx11::string::~string((string *)&local_778);
        goto LAB_001074df;
      }
      std::__cxx11::string::string((string *)&local_678,"new2old",(allocator *)&local_528);
      sVar7 = cxxopts::ParseResult::count(&result,&local_678);
      if (sVar7 == 0) {
        bVar21 = false;
      }
      else {
        std::__cxx11::string::string((string *)&local_698,"oldtap",(allocator *)&local_548);
        sVar7 = cxxopts::ParseResult::count(&result,&local_698);
        bVar21 = sVar7 != 0;
        std::__cxx11::string::~string((string *)&local_698);
      }
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&write_file);
      if (bVar21) {
        pcVar17 = "Only one target format is possible.";
        goto LAB_001074a3;
      }
    }
    std::__cxx11::string::string((string *)&write_file,"wav",(allocator *)&local_4c8);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    if (sVar7 == 0) {
      std::__cxx11::string::string((string *)&local_798,"tap",(allocator *)&local_4e8);
      sVar7 = cxxopts::ParseResult::count(&result,&local_798);
      if (sVar7 != 0) {
LAB_00107591:
        std::__cxx11::string::~string((string *)&local_798);
        goto LAB_0010759b;
      }
      std::__cxx11::string::string((string *)&local_778,"old2new",(allocator *)&local_508);
      sVar7 = cxxopts::ParseResult::count(&result,&local_778);
      if (sVar7 != 0) {
        std::__cxx11::string::~string((string *)&local_778);
        goto LAB_00107591;
      }
      std::__cxx11::string::string((string *)&local_678,"new2old",(allocator *)&local_528);
      sVar7 = cxxopts::ParseResult::count(&result,&local_678);
      if (sVar7 == 0) {
        std::__cxx11::string::string((string *)&local_698,"oldtap",(allocator *)&local_548);
        sVar7 = cxxopts::ParseResult::count(&result,&local_698);
        bVar21 = sVar7 == 0;
        std::__cxx11::string::~string((string *)&local_698);
      }
      else {
        bVar21 = false;
      }
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&local_798);
      std::__cxx11::string::~string((string *)&write_file);
      if (bVar21) {
        pcVar17 = "Target format is mandatory.";
        goto LAB_001074a3;
      }
    }
    else {
LAB_0010759b:
      std::__cxx11::string::~string((string *)&write_file);
    }
    std::__cxx11::string::string((string *)&write_file,"wav",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    bVar22 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"tap",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    bVar23 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"oldtap",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    bVar24 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"old2new",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    bVar25 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&write_file);
    std::__cxx11::string::string((string *)&write_file,"new2old",(allocator *)&local_798);
    sVar7 = cxxopts::ParseResult::count(&result,(string *)&write_file);
    bVar26 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&write_file);
    uVar13 = 0;
    bVar21 = true;
  }
  cxxopts::ParseResult::~ParseResult(&result);
  cxxopts::Options::~Options(&options);
  std::__cxx11::string::~string((string *)&name);
  if (!bVar21) goto LAB_00107904;
  if (bVar23) {
    wave::File::File((File *)&result);
    options.m_program._M_dataplus._M_p = (pointer)0x0;
    options.m_program._M_string_length = 0;
    options.m_program.field_2._M_allocated_capacity = 0;
    EVar5 = wave::File::Open((File *)&result,&input_file,kIn);
    if (EVar5 == kNoError) {
      EVar5 = wave::File::Read((File *)&result,(vector<float,_std::allocator<float>_> *)&options);
      if (EVar5 != kNoError) {
        pcVar17 = "Something went wrong while reading input file.";
        poVar9 = (ostream *)&std::cout;
        goto LAB_0010783b;
      }
      pFVar10 = fopen(output_file._M_dataplus._M_p,"wb");
      poVar9 = std::operator<<((ostream *)&std::cout,"Converting Orao WAV tape to TAP format.");
      std::endl<char,std::char_traits<char>>(poVar9);
      lVar14 = options.m_program._M_string_length - (long)options.m_program._M_dataplus._M_p;
      fputc(0x4f,pFVar10);
      bVar4 = 0x4f;
      bVar22 = false;
      bVar12 = 0;
      bVar21 = false;
      iVar15 = 0;
      for (lVar18 = 0; lVar14 >> 2 != lVar18; lVar18 = lVar18 + 1) {
        fVar1 = *(float *)(options.m_program._M_dataplus._M_p + lVar18 * 4);
        if (bVar21 == 0.0 < fVar1) {
          iVar16 = iVar15 + 1;
        }
        else {
          iVar16 = 0;
          if (bVar22) {
            bVar22 = false;
          }
          else {
            bVar4 = bVar4 * '\x02' | 10 < iVar15;
            if (bVar12 == 7) {
              fputc((int)(char)bVar4,pFVar10);
              bVar22 = true;
              bVar4 = 0;
              iVar16 = 0;
              bVar12 = 0;
            }
            else {
              bVar12 = bVar12 + 1;
              bVar22 = true;
            }
          }
        }
        bVar21 = 0.0 < fVar1;
        iVar15 = iVar16;
      }
      if (bVar12 != 0) {
        for (uVar13 = (uint)bVar12; uVar13 < 7; uVar13 = uVar13 + 1) {
          bVar4 = bVar4 * '\x02';
        }
LAB_00107da1:
        fputc((int)(char)bVar4,pFVar10);
      }
LAB_00107da9:
      fclose(pFVar10);
      uVar13 = 0;
    }
    else {
      pcVar17 = "Something went wrong while opening input file.";
      poVar9 = (ostream *)&std::cerr;
LAB_0010783b:
      poVar9 = std::operator<<(poVar9,pcVar17);
      std::endl<char,std::char_traits<char>>(poVar9);
LAB_001078e7:
      uVar13 = 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&options);
    this = &result;
  }
  else {
    if (bVar24) {
      wave::File::File((File *)&result);
      options.m_program._M_dataplus._M_p = (pointer)0x0;
      options.m_program._M_string_length = 0;
      options.m_program.field_2._M_allocated_capacity = 0;
      EVar5 = wave::File::Open((File *)&result,&input_file,kIn);
      if (EVar5 == kNoError) {
        EVar5 = wave::File::Read((File *)&result,(vector<float,_std::allocator<float>_> *)&options);
        if (EVar5 == kNoError) {
          pFVar10 = fopen(output_file._M_dataplus._M_p,"wb");
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Converting Orao WAV tape to old TAP format.");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "WARNING: Header is not formed well, so some emulators may not work."
                                  );
          std::endl<char,std::char_traits<char>>(poVar9);
          lVar14 = options.m_program._M_string_length - (long)options.m_program._M_dataplus._M_p;
          fputc(0x68,pFVar10);
          fputc(1,pFVar10);
          fputc(0,pFVar10);
          iVar15 = 0x165;
          while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
            fputc(0,pFVar10);
          }
          uVar20 = 0;
          bVar22 = false;
          bVar4 = 0;
          bVar21 = false;
          iVar15 = 0;
          for (lVar18 = 0; lVar14 >> 2 != lVar18; lVar18 = lVar18 + 1) {
            fVar1 = *(float *)(options.m_program._M_dataplus._M_p + lVar18 * 4);
            if (bVar21 == 0.0 < fVar1) {
              iVar16 = iVar15 + 1;
            }
            else {
              iVar16 = 0;
              if (bVar22) {
                bVar22 = false;
              }
              else {
                bVar12 = (10 < iVar15) << 7 | (byte)(uVar20 >> 1);
                uVar20 = (ulong)bVar12;
                if (bVar4 == 7) {
                  fputc((int)(char)bVar12,pFVar10);
                  bVar22 = true;
                  uVar20 = 0;
                  iVar16 = 0;
                  bVar4 = 0;
                }
                else {
                  bVar4 = bVar4 + 1;
                  bVar22 = true;
                }
              }
            }
            bVar21 = 0.0 < fVar1;
            iVar15 = iVar16;
          }
          if (bVar4 != 0) {
            for (uVar13 = (uint)bVar4; bVar4 = (byte)uVar20, uVar13 < 7; uVar13 = uVar13 + 1) {
              uVar20 = (ulong)(bVar4 >> 1);
            }
            goto LAB_00107da1;
          }
          goto LAB_00107da9;
        }
        pcVar17 = "Something went wrong while reading input file.";
        poVar9 = (ostream *)&std::cout;
      }
      else {
        pcVar17 = "Something went wrong while opening input file.";
        poVar9 = (ostream *)&std::cerr;
      }
      poVar9 = std::operator<<(poVar9,pcVar17);
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_001078e7;
    }
    if (!bVar22) {
      if (bVar25) {
        std::ifstream::ifstream(&options,(string *)&input_file,_S_bin);
        uVar2 = *(uint *)((long)&options.m_help_string._M_dataplus._M_p +
                         *(long *)(options.m_program._M_dataplus._M_p + -0x18));
        if ((uVar2 & 5) == 0) {
          result.m_keys._M_h._M_buckets = (__buckets_ptr)0x0;
          result.m_keys._M_h._M_bucket_count = 0;
          result.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Converting Orao old TAP tape to new TAP format.");
          std::endl<char,std::char_traits<char>>(poVar9);
          std::istream::seekg((long)&options,_S_beg);
          sVar11 = std::istream::tellg();
          std::istream::seekg((long)&options,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result,sVar11);
          std::istream::read((char *)&options,(long)result.m_keys._M_h._M_buckets);
          pFVar10 = fopen(output_file._M_dataplus._M_p,"wb");
          fputc(0x4f,pFVar10);
          for (uVar20 = 0x168;
              uVar20 < result.m_keys._M_h._M_bucket_count - (long)result.m_keys._M_h._M_buckets;
              uVar20 = uVar20 + 1) {
            bVar4 = *(byte *)((long)result.m_keys._M_h._M_buckets + uVar20) << 4 |
                    *(byte *)((long)result.m_keys._M_h._M_buckets + uVar20) >> 4;
            bVar4 = bVar4 >> 2 & 0x33 | (bVar4 & 0x33) << 2;
            fputc((int)(char)(bVar4 >> 1 & 0x55 | (bVar4 & 0x55) * '\x02'),pFVar10);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&result);
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
          std::endl<char,std::char_traits<char>>(poVar9);
          uVar13 = 1;
        }
        std::ifstream::~ifstream(&options);
        if ((uVar2 & 5) != 0) goto LAB_00107904;
      }
      if (bVar26) {
        std::ifstream::ifstream(&options,(string *)&input_file,_S_bin);
        uVar2 = *(uint *)((long)&options.m_help_string._M_dataplus._M_p +
                         *(long *)(options.m_program._M_dataplus._M_p + -0x18));
        if ((uVar2 & 5) == 0) {
          result.m_keys._M_h._M_buckets = (__buckets_ptr)0x0;
          result.m_keys._M_h._M_bucket_count = 0;
          result.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Converting Orao new TAP tape to old TAP format.");
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "WARNING: Header is not formed well, so some emulators may not work."
                                  );
          std::endl<char,std::char_traits<char>>(poVar9);
          std::istream::seekg((long)&options,_S_beg);
          sVar11 = std::istream::tellg();
          std::istream::seekg((long)&options,_S_beg);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&result,sVar11);
          std::istream::read((char *)&options,(long)result.m_keys._M_h._M_buckets);
          pFVar10 = fopen(output_file._M_dataplus._M_p,"wb");
          fputc(0x68,pFVar10);
          fputc(1,pFVar10);
          fputc(0,pFVar10);
          iVar15 = 0x165;
          while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
            fputc(0,pFVar10);
          }
          for (uVar20 = 1;
              uVar20 < result.m_keys._M_h._M_bucket_count - (long)result.m_keys._M_h._M_buckets;
              uVar20 = uVar20 + 1) {
            bVar4 = *(byte *)((long)result.m_keys._M_h._M_buckets + uVar20) << 4 |
                    *(byte *)((long)result.m_keys._M_h._M_buckets + uVar20) >> 4;
            bVar4 = bVar4 >> 2 & 0x33 | (bVar4 & 0x33) << 2;
            fputc((int)(char)(bVar4 >> 1 & 0x55 | (bVar4 & 0x55) * '\x02'),pFVar10);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&result);
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
          std::endl<char,std::char_traits<char>>(poVar9);
          uVar13 = 1;
        }
        std::ifstream::~ifstream(&options);
        if ((uVar2 & 5) != 0) goto LAB_00107904;
      }
      uVar13 = 0;
      goto LAB_00107904;
    }
    wave::File::File(&write_file);
    result.m_keys._M_h._M_buckets = (__buckets_ptr)0x0;
    result.m_keys._M_h._M_bucket_count = 0;
    result.m_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar13 = 1;
    EVar5 = wave::File::Open(&write_file,&output_file,kOut);
    if (EVar5 == kNoError) {
      std::ifstream::ifstream(&options,(string *)&input_file,_S_bin);
      if ((*(byte *)((long)&options.m_help_string._M_dataplus._M_p +
                    *(long *)(options.m_program._M_dataplus._M_p + -0x18)) & 5) == 0) {
        name._M_dataplus._M_p = (pointer)0x0;
        name._M_string_length = 0;
        name.field_2._M_allocated_capacity = 0;
        poVar9 = std::operator<<((ostream *)&std::cout,"Converting Orao TAP tape to WAV format.");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::istream::seekg((long)&options,_S_beg);
        lVar14 = std::istream::tellg();
        std::istream::seekg((long)&options,_S_cur);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&name,lVar14 - 1);
        std::istream::read((char *)&options,(long)name._M_dataplus._M_p);
        sVar3 = name._M_string_length;
        for (_Var19 = name._M_dataplus; _Var19._M_p != (pointer)sVar3; _Var19._M_p = _Var19._M_p + 1
            ) {
          bVar4 = *_Var19._M_p;
          for (uVar13 = 7; uVar13 != 0xffffffff; uVar13 = uVar13 - 1) {
            if ((bVar4 >> (uVar13 & 0x1f) & 1) == 0) {
              iVar15 = 9;
              orao_output_wave((vector<float,_std::allocator<float>_> *)&result,24576.0,9);
            }
            else {
              iVar15 = 0x11;
              orao_output_wave((vector<float,_std::allocator<float>_> *)&result,24576.0,0x11);
            }
            orao_output_wave((vector<float,_std::allocator<float>_> *)&result,-24576.0,iVar15);
          }
        }
        EVar5 = wave::File::Write(&write_file,(vector<float,_std::allocator<float>_> *)&result);
        if (EVar5 != kNoError) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Something went wrong while writing output file.");
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        uVar13 = (uint)(EVar5 != kNoError);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&name);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Failed to open input file");
        std::endl<char,std::char_traits<char>>(poVar9);
        uVar13 = 1;
      }
      std::ifstream::~ifstream(&options);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "Something went wrong while opening output file.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&result);
    this = (ParseResult *)&write_file;
  }
  wave::File::~File((File *)this);
LAB_00107904:
  std::__cxx11::string::~string((string *)&output_file);
  std::__cxx11::string::~string((string *)&input_file);
  return uVar13;
}

Assistant:

int main(int argc, const char* argv[])
{
	std::string input_file;
	std::string output_file;
	bool wav_to_tap = false;
	bool wav_to_oldtap = false;
	bool tap_to_wav = false;
	bool old_to_new = false;
	bool new_to_old = false;
	try
	{
		std::string name = argv[0];
		cxxopts::Options options(name.c_str(), name + " - Orao cassette tape tool");
		options
			.positional_help("[optional args]")
			.show_positional_help();

		options
			.allow_unrecognised_options()
			.add_options()
			("i,input", "Input", cxxopts::value<std::string>())
			("o,output", "Output file", cxxopts::value<std::string>())
			("tap", "Convert WAV to TAP", cxxopts::value<bool>())
			("oldtap", "Convert WAV to oldTAP", cxxopts::value<bool>())
			("wav", "Convert TAP to WAV", cxxopts::value<bool>())
			("old2new", "Convert old TAP to new TAP", cxxopts::value<bool>())
			("new2old", "Convert new TAP to old TAP <WARNING: header will not be good>", cxxopts::value<bool>())
			("help", "Print help")
		;

		options.parse_positional({"input", "output"});

		auto result = options.parse(argc, argv);

		if (result.count("help") || result.arguments().empty())
		{
			std::cout << options.help() << std::endl;
			exit(0);
		}

		if (result.count("input"))
		{
			input_file = result["input"].as<std::string>();
		} else {
			std::cerr << "Input file is mandatory." << std::endl;
			return 1;
		}

		if (result.count("output"))
		{
			output_file = result["output"].as<std::string>();
		} else {
			std::cerr << "Output file is mandatory." << std::endl;	
			return 1;
		}

		if (result.count("wav") && result.count("tap") && result.count("old2new") && result.count("new2old") && result.count("oldtap"))
		{
			std::cerr << "Only one target format is possible." << std::endl;	
			return 1;
		}
		if (!result.count("wav") && !result.count("tap") && !result.count("old2new") && !result.count("new2old") && !result.count("oldtap"))
		{
			std::cerr << "Target format is mandatory." << std::endl;	
			return 1;
		}
		if (result.count("wav")) tap_to_wav = true;
		if (result.count("tap")) wav_to_tap = true;
		if (result.count("oldtap")) wav_to_oldtap = true;
		if (result.count("old2new")) old_to_new = true;
		if (result.count("new2old")) new_to_old = true;

	}
	catch (const cxxopts::OptionException& e)
	{
		std::cerr << "Error parsing options: " << e.what() << std::endl;
		return 1;
	}

	if (wav_to_tap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to TAP format." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 1 : 0;
						data = (data << 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data << 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (wav_to_oldtap) {
		wave::File read_file;
		std::vector<float> content;	
		wave::Error err = read_file.Open(input_file, wave::kIn);
		if (err) {
			std::cerr << "Something went wrong while opening input file." << std::endl;
			return 1;
		}
		err = read_file.Read(&content);
		if (err) {
			std::cout << "Something went wrong while reading input file." << std::endl;
			return 1;
		}
		FILE *fp = fopen(output_file.c_str(), "wb");

		std::cout << "Converting Orao WAV tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		size_t numSamples = content.size();
		int cnt = 0;
		bool firstPart = false;
		uint8_t bit = 0;
		uint8_t prevVal = 0;
		uint8_t bitcounter = 0;
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (size_t i = 0; i < numSamples; i++)
		{
			double currentSample = content[i];
			uint8_t val = (currentSample > 0) ? 1 : 0;
			if (prevVal == val)
				cnt++;
			else {
				bit = (cnt>=12) ? 1 : 0;
				if (!firstPart) {
						bit = (cnt>=11) ? 0x80 : 0;
						data = (data >> 1) | bit;
						if (bitcounter == 7) {
							fwrite(&data, 1, 1, fp);
							data = 0;
							bitcounter = 0;
						} else {
							bitcounter++;
						}
					firstPart = true;
				} else {
					firstPart = false;
				}
				cnt = 0;
			}
			prevVal = val;
		}
		if (bitcounter != 0) {
			for(int i=bitcounter; i<7; i++)
				data = (data >> 1);
			fwrite(&data, 1, 1, fp);
		}
		fclose(fp);
		return 0;
	}
	if (tap_to_wav) {
		wave::File write_file;
		std::vector<float> content;	
		wave::Error err = write_file.Open(output_file, wave::kOut);
		if (err) {
			std::cerr << "Something went wrong while opening output file." << std::endl;
			return 1;
		}
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao TAP tape to WAV format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg())-1;
		fs.seekg(1, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		for(uint8_t byte : bytes) {
			for (int j=0;j<8;j++) {
				uint8_t b = (byte >> (7-j)) & 1;
				if (b==0) {
					orao_output_wave(&content, WAVE_LOW , ORAO_WAVE_ZERO);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ZERO);
				} else {
					orao_output_wave(&content, WAVE_LOW,  ORAO_WAVE_ONE);
					orao_output_wave(&content, WAVE_HIGH, ORAO_WAVE_ONE);
				}
			}
		}
		err = write_file.Write(content);
		if (err) {
			std::cout << "Something went wrong while writing output file." << std::endl;
			return 1;
		}
		return 0;
	}
	if (old_to_new) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao old TAP tape to new TAP format." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x4f;
		// Make first byte same as in tool from Josip
		fwrite(&data, 1, 1, fp);
		for (int i = ORAO_HEADER_SIZE; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	if (new_to_old) {
		std::ifstream fs(input_file, std::ios_base::binary);
		if (!fs) {
			std::cerr << "Failed to open input file" << std::endl;
			return 1;
		}
		std::vector<uint8_t> bytes; 
		std::cout << "Converting Orao new TAP tape to old TAP format." << std::endl;
		std::cout << "WARNING: Header is not formed well, so some emulators may not work." << std::endl;
		fs.seekg(0, fs.end);
		size_t length = size_t(fs.tellg());
		fs.seekg(0, fs.beg);
		bytes.resize(length);
		fs.read(reinterpret_cast<char *>(&(bytes[0])), length);
		FILE *fp = fopen(output_file.c_str(), "wb");
		uint8_t data = 0x68; fwrite(&data, 1, 1, fp);
		data = 0x01; fwrite(&data, 1, 1, fp);
		data = 0x00; fwrite(&data, 1, 1, fp);
		for (int i = 0; i < ORAO_HEADER_SIZE -3; i++) {
			fwrite(&data, 1, 1, fp); // fill rest of header with 0
		}
		for (int i = 1; i < bytes.size(); i++) {
			data = reverse(bytes[i]);
			fwrite(&data, 1, 1, fp);
		}
	}
	return 0;
}